

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

wstring * PDA::Transducer::Generator::call(wstring *__return_storage_ptr__,wstring *label)

{
  allocator<wchar_t> local_11;
  
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)__return_storage_ptr__,L"call\t",&local_11);
  std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::wstring Generator::call(const std::wstring &label)
{
    std::wstring result = L"call\t";
    result += label;
    return result;
}